

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void * __thiscall
testing::internal::UntypedFunctionMockerBase::MockObject(UntypedFunctionMockerBase *this)

{
  void *pvVar1;
  allocator<char> local_41;
  string local_40;
  GTestMutexLock local_20;
  MutexLock l;
  void *mock_obj;
  UntypedFunctionMockerBase *this_local;
  
  GTestMutexLock::GTestMutexLock(&local_20,(MutexBase *)g_gmock_mutex);
  pvVar1 = this->mock_obj_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "MockObject() must not be called before RegisterOwner() or SetOwnerAndName() has been called."
             ,&local_41);
  Assert(pvVar1 != (void *)0x0,
         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/src/gmock-spec-builders.cc"
         ,0x15c,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  l.mutex_ = (MutexBase *)this->mock_obj_;
  GTestMutexLock::~GTestMutexLock(&local_20);
  return l.mutex_;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const void* mock_obj;
  {
    // We protect mock_obj_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(mock_obj_ != nullptr, __FILE__, __LINE__,
           "MockObject() must not be called before RegisterOwner() or "
           "SetOwnerAndName() has been called.");
    mock_obj = mock_obj_;
  }
  return mock_obj;
}